

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_hilbert.cpp
# Opt level: O2

Read<long> __thiscall Omega_h::hilbert::dists_from_coords_dim<2>(hilbert *this,Reals *coords)

{
  Alloc *pAVar1;
  void *pvVar2;
  bool bVar3;
  Int i;
  int n;
  long lVar4;
  void *extraout_RDX;
  size_t sVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  Read<long> RVar8;
  Write<long> out;
  Alloc *local_f8;
  void *pvStack_f0;
  type_conflict local_e8;
  Alloc *local_98;
  void *pvStack_90;
  double local_88;
  double local_80;
  Write<int> local_78;
  Write<double> local_68;
  Vector<2> s;
  BBox<2> local_48;
  Alloc *local_28;
  void *pvStack_20;
  
  Write<double>::Write(&local_68,&coords->write_);
  find_bounding_box<2>(&local_48,(Reals *)&local_68);
  Write<double>::~Write(&local_68);
  local_e8.unit_affine.r.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[0] =
       local_48.max.super_Few<double,_2>.array_[0];
  local_e8.unit_affine.r.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[1] =
       local_48.max.super_Few<double,_2>.array_[1];
  local_e8.coords.write_.shared_alloc_.alloc = (Alloc *)local_48.min.super_Few<double,_2>.array_[0];
  local_e8.coords.write_.shared_alloc_.direct_ptr =
       (void *)local_48.min.super_Few<double,_2>.array_[1];
  local_f8 = (Alloc *)local_48.max.super_Few<double,_2>.array_[0];
  pvStack_f0 = (void *)local_48.max.super_Few<double,_2>.array_[1];
  local_98 = (Alloc *)local_48.min.super_Few<double,_2>.array_[0];
  pvStack_90 = (void *)local_48.min.super_Few<double,_2>.array_[1];
  for (lVar4 = 0; lVar4 != 2; lVar4 = lVar4 + 1) {
    (&out.shared_alloc_.alloc)[lVar4] =
         (Alloc *)((double)(&local_f8)[lVar4] - (double)(&local_98)[lVar4]);
  }
  uVar6 = SUB84(out.shared_alloc_.direct_ptr,0);
  uVar7 = (undefined4)((ulong)out.shared_alloc_.direct_ptr >> 0x20);
  if ((double)out.shared_alloc_.direct_ptr <= (double)out.shared_alloc_.alloc) {
    uVar6 = SUB84(out.shared_alloc_.alloc,0);
    uVar7 = (undefined4)((ulong)out.shared_alloc_.alloc >> 0x20);
  }
  for (lVar4 = 2; lVar4 != 4; lVar4 = lVar4 + 1) {
    *(double *)
     ((long)(local_e8.unit_affine.r.super_Few<Omega_h::Vector<2>,_2>.array_ + -1) + lVar4 * 8) =
         (double)(&local_f8)[lVar4] + (double)CONCAT44(uVar7,uVar6);
  }
  local_48.max.super_Few<double,_2>.array_[0] =
       local_e8.unit_affine.r.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_
       [0];
  local_48.max.super_Few<double,_2>.array_[1] =
       local_e8.unit_affine.r.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_
       [1];
  for (lVar4 = 0; lVar4 != 2; lVar4 = lVar4 + 1) {
    s.super_Few<double,_2>.array_[lVar4] =
         1.0 / (*(double *)
                 ((long)&local_e8.unit_affine.r.super_Few<Omega_h::Vector<2>,_2>.array_[0].
                         super_Few<double,_2> + lVar4 * 8) -
               *(double *)
                ((long)(local_e8.unit_affine.r.super_Few<Omega_h::Vector<2>,_2>.array_ + -1) +
                lVar4 * 8));
  }
  local_88 = s.super_Few<double,_2>.array_[0];
  local_f8 = (Alloc *)s.super_Few<double,_2>.array_[0];
  pvStack_f0 = (void *)0x0;
  for (lVar4 = 0; lVar4 != 2; lVar4 = lVar4 + 1) {
    (&out.shared_alloc_.alloc)[lVar4] =
         (Alloc *)((double)(&local_f8)[lVar4] * local_48.min.super_Few<double,_2>.array_[0]);
  }
  bVar3 = true;
  while (pvVar2 = out.shared_alloc_.direct_ptr, pAVar1 = out.shared_alloc_.alloc, bVar3) {
    local_f8 = (Alloc *)0x0;
    pvStack_f0 = (void *)s.super_Few<double,_2>.array_[1];
    for (lVar4 = 0; lVar4 != 2; lVar4 = lVar4 + 1) {
      (&out.shared_alloc_.alloc)[lVar4] =
           (Alloc *)((double)(&local_f8)[lVar4] * local_48.min.super_Few<double,_2>.array_[1]);
    }
    local_f8 = pAVar1;
    pvStack_f0 = pvVar2;
    local_98 = out.shared_alloc_.alloc;
    pvStack_90 = out.shared_alloc_.direct_ptr;
    for (lVar4 = 0; lVar4 != 2; lVar4 = lVar4 + 1) {
      (&out.shared_alloc_.alloc)[lVar4] =
           (Alloc *)((double)(&local_f8)[lVar4] + (double)(&local_98)[lVar4]);
    }
    bVar3 = false;
  }
  local_f8 = out.shared_alloc_.alloc;
  pvStack_f0 = out.shared_alloc_.direct_ptr;
  for (lVar4 = 0; lVar4 != 2; lVar4 = lVar4 + 1) {
    (&out.shared_alloc_.alloc)[lVar4] = (Alloc *)((ulong)(&local_f8)[lVar4] ^ 0x8000000000000000);
  }
  pAVar1 = (coords->write_).shared_alloc_.alloc;
  local_80 = s.super_Few<double,_2>.array_[1];
  if (((ulong)pAVar1 & 1) == 0) {
    sVar5 = pAVar1->size;
  }
  else {
    sVar5 = (ulong)pAVar1 >> 3;
  }
  local_28 = out.shared_alloc_.alloc;
  pvStack_20 = out.shared_alloc_.direct_ptr;
  n = divide_no_remainder<int>((int)(sVar5 >> 3),2);
  std::__cxx11::string::string((string *)&local_e8,"",(allocator *)&local_f8);
  Write<long>::Write(&out,n * 2,(string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  Write<double>::Write((Write<double> *)&local_e8,&coords->write_);
  local_e8.unit_affine.r.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[0] =
       local_88;
  local_e8.unit_affine.r.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[1] =
       0.0;
  local_e8.unit_affine.r.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[0] =
       0.0;
  local_e8.unit_affine.r.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[1] =
       local_80;
  local_e8.unit_affine.t.super_Few<double,_2>.array_[0] = (double)local_28;
  local_e8.unit_affine.t.super_Few<double,_2>.array_[1] = (double)pvStack_20;
  Write<long>::Write((Write<int> *)&local_e8.out,(Write<int> *)&out);
  parallel_for<Omega_h::hilbert::dists_from_coords_dim<2>(Omega_h::Read<double>)::_lambda(int)_1_>
            (n,&local_e8,"hilbert::dists_from_coords");
  Write<long>::Write(&local_78,(Write<int> *)&out);
  Read<long>::Read((Read<signed_char> *)this,(Write<long> *)&local_78);
  Write<long>::~Write((Write<long> *)&local_78);
  dists_from_coords_dim<2>(Omega_h::Read<double>)::{lambda(int)#1}::~Read
            ((_lambda_int__1_ *)&local_e8);
  Write<long>::~Write(&out);
  RVar8.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar8.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<long>)RVar8.write_.shared_alloc_;
}

Assistant:

Read<I64> dists_from_coords_dim(Reals coords) {
  auto bbox = find_bounding_box<dim>(coords);
  bbox = make_equilateral(bbox);
  auto unit_affine = get_affine_from_bbox_into_unit(bbox);
  auto npts = divide_no_remainder(coords.size(), dim);
  Write<I64> out(npts * dim);
  auto f = OMEGA_H_LAMBDA(LO i) {
    constexpr Int nbits = MANTISSA_BITS;
    auto spatial_coord = get_vector<dim>(coords, i);
    auto hilbert_coord =
        hilbert::from_spatial(unit_affine, nbits, spatial_coord);
    for (Int j = 0; j < dim; ++j) {
      auto sv = static_cast<I64>(hilbert_coord[j]);
      OMEGA_H_CHECK(sv >= 0);
      out[i * dim + j] = sv;
    }
  };
  parallel_for(npts, f, "hilbert::dists_from_coords");
  return out;
}